

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_generator.cc
# Opt level: O3

bool __thiscall re2::StringGenerator::IncrementDigits(StringGenerator *this)

{
  int iVar1;
  pointer piVar2;
  iterator __position;
  pointer pbVar3;
  pointer pbVar4;
  bool bVar5;
  uint in_EAX;
  uint uVar6;
  ulong uVar7;
  undefined8 uStack_8;
  
  piVar2 = (this->digits_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  __position._M_current =
       (this->digits_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_finish;
  uVar6 = (uint)((ulong)((long)__position._M_current - (long)piVar2) >> 2);
  if (0 < (int)uVar6) {
    pbVar3 = (this->alphabet_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar4 = (this->alphabet_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar7 = (ulong)(uVar6 & 0x7fffffff) + 1;
    do {
      iVar1 = piVar2[uVar7 - 2];
      piVar2[uVar7 - 2] = iVar1 + 1;
      if (iVar1 + 1 < (int)((ulong)((long)pbVar3 - (long)pbVar4) >> 5)) goto LAB_0011d01e;
      piVar2[uVar7 - 2] = 0;
      uVar7 = uVar7 - 1;
    } while (1 < uVar7);
  }
  if ((int)uVar6 < this->maxlen_) {
    uStack_8 = (ulong)in_EAX;
    if (__position._M_current ==
        (this->digits_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&this->digits_,__position,(int *)((long)&uStack_8 + 4));
    }
    else {
      *__position._M_current = 0;
      (this->digits_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = __position._M_current + 1;
    }
LAB_0011d01e:
    bVar5 = true;
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool StringGenerator::IncrementDigits() {
  // First try to increment the current number.
  for (int i = static_cast<int>(digits_.size()) - 1; i >= 0; i--) {
    if (++digits_[i] < static_cast<int>(alphabet_.size()))
      return true;
    digits_[i] = 0;
  }

  // If that failed, make a longer number.
  if (static_cast<int>(digits_.size()) < maxlen_) {
    digits_.push_back(0);
    return true;
  }

  return false;
}